

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

void ch_object_print(ch_object *object)

{
  char *__format;
  
  switch(object->type) {
  case TYPE_FUNCTION:
    __format = "FUNCTION";
    break;
  case TYPE_CLOSURE:
    __format = "CLOSURE FUNCTION";
    break;
  case TYPE_UPVALUE:
    __format = "UPVALUE";
    break;
  case TYPE_NATIVE:
    __format = "NATIVE";
    break;
  case TYPE_STRING:
    printf("STRING %s",*(undefined8 *)(object + 2));
  default:
    goto switchD_00101b01_default;
  }
  printf(__format);
switchD_00101b01_default:
  putchar(10);
  return;
}

Assistant:

void ch_object_print(ch_object* object) {
  switch(object->type) {
    case TYPE_CLOSURE: {
      printf("CLOSURE FUNCTION");
      break;
    }
    case TYPE_UPVALUE: {
      printf("UPVALUE");
      break;
    }
    case TYPE_FUNCTION: {
      printf("FUNCTION");
      break;
    }
    case TYPE_NATIVE: {
      printf("NATIVE");
      break;
    }
    case TYPE_STRING: {
      printf("STRING %s", AS_STRING(object)->value);
      break;
    }
  }

  printf("\n");
}